

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupInvMiter(Gia_Man_t *p,Gia_Man_t *pInv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Gia_Man_t *p_00;
  size_t sVar12;
  char *pcVar13;
  Gia_Obj_t *pGVar14;
  Gia_Man_t *pGVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43c,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pInv->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pInv) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43d,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pInv->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pInv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43e,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p->nRegs != pInv->vCis->nSize) {
    __assert_fail("Gia_ManRegNum(p) == Gia_ManCiNum(pInv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43f,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(pInv->nObjs * 2 + p->nObjs);
  pcVar5 = p->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar5);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar5);
  }
  p_00->pName = pcVar13;
  pcVar5 = p->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar5);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar5);
  }
  p_00->pSpec = pcVar13;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar10 = p->nObjs;
  if (1 < iVar10) {
    lVar20 = 1;
    lVar17 = 0x14;
    do {
      pGVar6 = p->pObjs;
      uVar18 = *(ulong *)((long)pGVar6 + lVar17 + -8);
      uVar16 = (uint)uVar18;
      iVar10 = (int)(uVar18 & 0x1fffffff);
      if ((uVar18 & 0x1fffffff) == 0x1fffffff || (int)uVar16 < 0) {
        if ((uVar16 & 0x9fffffff) == 0x9fffffff) {
          pGVar14 = Gia_ManAppendObj(p_00);
          uVar18 = *(ulong *)pGVar14;
          *(ulong *)pGVar14 = uVar18 | 0x9fffffff;
          *(ulong *)pGVar14 =
               uVar18 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar8 = p_00->pObjs;
          if ((pGVar14 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar14)) {
LAB_001de36e:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar8) >> 2) * -0x55555555);
          pGVar8 = p_00->pObjs;
          if ((pGVar14 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar14)) goto LAB_001de36e;
          uVar9 = (int)((ulong)((long)pGVar14 - (long)pGVar8) >> 2) * 0x55555556;
          goto LAB_001ddf75;
        }
        if ((int)uVar16 < 0 && iVar10 != 0x1fffffff) {
          uVar9 = *(uint *)((long)pGVar6 + lVar17 + (ulong)(uint)(iVar10 << 2) * -3);
          if (-1 < (int)uVar9) {
            uVar9 = uVar9 ^ uVar16 >> 0x1d & 1;
            goto LAB_001ddf75;
          }
          goto LAB_001de330;
        }
      }
      else {
        uVar16 = *(uint *)((long)pGVar6 + lVar17 + (ulong)(uint)(iVar10 << 2) * -3);
        if (((int)uVar16 < 0) ||
           (uVar9 = *(uint *)((long)pGVar6 +
                             lVar17 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar9 < 0)) goto LAB_001de330;
        uVar9 = Gia_ManHashAnd(p_00,uVar16 ^ (uint)(uVar18 >> 0x1d) & 1,
                               uVar9 ^ (uint)(uVar18 >> 0x3d) & 1);
LAB_001ddf75:
        *(uint *)(&pGVar6->field_0x0 + lVar17) = uVar9;
      }
      lVar20 = lVar20 + 1;
      iVar10 = p->nObjs;
      lVar17 = lVar17 + 0xc;
    } while (lVar20 < iVar10);
  }
  iVar1 = p->nRegs;
  if (0 < (long)iVar1) {
    pVVar7 = p->vCis;
    iVar2 = pVVar7->nSize;
    uVar18 = (ulong)(uint)(iVar2 - iVar1);
    lVar17 = 0;
    do {
      if (((int)uVar18 < 0) || (iVar2 <= (int)uVar18)) goto LAB_001de34f;
      iVar3 = pVVar7->pArray[uVar18];
      if (((long)iVar3 < 0) || (iVar10 <= iVar3)) goto LAB_001de311;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (pInv->vCis->nSize <= lVar17) goto LAB_001de34f;
      iVar4 = pInv->vCis->pArray[lVar17];
      if (((long)iVar4 < 0) || (pInv->nObjs <= iVar4)) goto LAB_001de311;
      pInv->pObjs[iVar4].Value = p->pObjs[iVar3].Value;
      lVar17 = lVar17 + 1;
      uVar18 = uVar18 + 1;
    } while (iVar1 != lVar17);
  }
  uVar16 = pInv->nObjs;
  if (0 < (int)uVar16) {
    lVar17 = 8;
    lVar20 = 0;
    do {
      pGVar6 = pInv->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar18 = *(ulong *)((long)pGVar6 + lVar17 + -8);
      if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
        uVar16 = *(uint *)((long)pGVar6 +
                          lVar17 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3);
        if ((int)uVar16 < 0) goto LAB_001de330;
        uVar9 = *(uint *)((long)pGVar6 + lVar17 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3)
        ;
        if ((int)uVar9 < 0) goto LAB_001de330;
        iVar10 = Gia_ManHashAnd(p_00,uVar16 ^ (uint)(uVar18 >> 0x1d) & 1,
                                uVar9 ^ (uint)(uVar18 >> 0x3d) & 1);
        *(int *)(&pGVar6->field_0x0 + lVar17) = iVar10;
        uVar16 = pInv->nObjs;
      }
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar20 < (int)uVar16);
  }
  if (0 < pInv->vCos->nSize) {
    iVar10 = *pInv->vCos->pArray;
    if (((long)iVar10 < 0) || ((int)uVar16 <= iVar10)) {
LAB_001de311:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar8 = pInv->pObjs;
    pGVar6 = pGVar8 + iVar10;
    uVar19 = (uint)*(undefined8 *)pGVar6;
    uVar9 = pGVar6[-(ulong)(uVar19 & 0x1fffffff)].Value;
    if (-1 < (int)uVar9) {
      iVar10 = p->nRegs;
      if (0 < (long)iVar10) {
        pVVar7 = p->vCos;
        iVar1 = pVVar7->nSize;
        uVar18 = (ulong)(uint)(iVar1 - iVar10);
        lVar17 = 0;
        do {
          if (((int)uVar18 < 0) || (iVar1 <= (int)uVar18)) goto LAB_001de34f;
          iVar2 = pVVar7->pArray[uVar18];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001de311;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (pInv->vCis->nSize <= lVar17) goto LAB_001de34f;
          uVar11 = pInv->vCis->pArray[lVar17];
          if (((long)(int)uVar11 < 0) || (uVar16 <= uVar11)) goto LAB_001de311;
          pGVar8[(int)uVar11].Value = p->pObjs[iVar2].Value;
          lVar17 = lVar17 + 1;
          uVar18 = uVar18 + 1;
        } while (iVar10 != lVar17);
      }
      lVar17 = 8;
      lVar20 = 0;
      do {
        pGVar6 = pInv->pObjs;
        if (pGVar6 == (Gia_Obj_t *)0x0) break;
        uVar18 = *(ulong *)((long)pGVar6 + lVar17 + -8);
        if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
          uVar16 = *(uint *)((long)pGVar6 +
                            lVar17 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3);
          if (((int)uVar16 < 0) ||
             (uVar11 = *(uint *)((long)pGVar6 +
                                lVar17 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar11 < 0)) goto LAB_001de330;
          iVar10 = Gia_ManHashAnd(p_00,uVar16 ^ (uint)(uVar18 >> 0x1d) & 1,
                                  uVar11 ^ (uint)(uVar18 >> 0x3d) & 1);
          *(int *)(&pGVar6->field_0x0 + lVar17) = iVar10;
          uVar16 = pInv->nObjs;
        }
        lVar20 = lVar20 + 1;
        lVar17 = lVar17 + 0xc;
      } while (lVar20 < (int)uVar16);
      if (pInv->vCos->nSize < 1) goto LAB_001de34f;
      iVar10 = *pInv->vCos->pArray;
      if (((long)iVar10 < 0) || ((int)uVar16 <= iVar10)) goto LAB_001de311;
      uVar11 = (uint)*(undefined8 *)(pInv->pObjs + iVar10);
      uVar16 = (pInv->pObjs + iVar10)[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if (-1 < (int)uVar16) {
        iVar10 = Gia_ManHashAnd(p_00,uVar19 >> 0x1d & 1 ^ uVar9,uVar16 ^ uVar11 >> 0x1d & 1 ^ 1);
        Gia_ManAppendCo(p_00,iVar10);
        pGVar15 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar15;
      }
    }
LAB_001de330:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
LAB_001de34f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupInvMiter( Gia_Man_t * p, Gia_Man_t * pInv )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Node1, Node2, Node;
    assert( Gia_ManRegNum(p) > 0 );
    assert( Gia_ManRegNum(pInv) == 0 );
    assert( Gia_ManCoNum(pInv) == 1 );
    assert( Gia_ManRegNum(p) == Gia_ManCiNum(pInv) );
    Gia_ManFillValue(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2*Gia_ManObjNum(pInv) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    // build invariant on top of register outputs in the first frame
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node1 = Gia_ObjFanin0Copy(pObj);
    // build invariant on top of register outputs in the second frame
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node2 = Gia_ObjFanin0Copy(pObj);
    // create miter output
    Node = Gia_ManHashAnd( pNew, Node1, Abc_LitNot(Node2) );
    Gia_ManAppendCo( pNew, Node );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}